

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined4 *puVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>
  *__tmp;
  
  bVar4 = AtEnd(this);
  if (!bVar4) {
    puVar5 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                         + 0x28))();
    puVar6 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestVideoParam>_*,_false>
                         + 0x28))();
    puVar7 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>_*,_false>
                         + 0x28))();
    puVar8 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
                                   .super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>_>.
                                   super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>
                                   ._M_head_impl.impl_ + 0x28))();
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var9->_M_use_count = 1;
    p_Var9->_M_weak_count = 1;
    p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0104a8a0;
    *(undefined4 *)&p_Var9[1]._vptr__Sp_counted_base = *puVar8;
    *(undefined8 *)((long)&p_Var9[1]._vptr__Sp_counted_base + 4) = *puVar7;
    p_Var9[4]._vptr__Sp_counted_base = (_func_int **)puVar6[4];
    pp_Var2 = (_func_int **)*puVar6;
    uVar1 = puVar6[1];
    uVar3 = puVar6[3];
    p_Var9[3]._vptr__Sp_counted_base = (_func_int **)puVar6[2];
    p_Var9[3]._M_use_count = (int)uVar3;
    p_Var9[3]._M_weak_count = (int)((ulong)uVar3 >> 0x20);
    p_Var9[2]._vptr__Sp_counted_base = pp_Var2;
    p_Var9[2]._M_use_count = (int)uVar1;
    p_Var9[2]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
    uVar1 = *puVar5;
    p_Var9[4]._M_use_count = (int)uVar1;
    p_Var9[4]._M_weak_count = (int)((ulong)uVar1 >> 0x20);
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var9 + 1);
    this_00 = (this->current_value_).
              super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var9;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      return;
    }
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }